

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modified.cpp
# Opt level: O1

void __thiscall modified::restore(modified *this)

{
  int iVar1;
  branch_and_reduce_algorithm *pbVar2;
  int *piVar3;
  pointer pvVar4;
  pointer piVar5;
  pointer piVar6;
  iterator __begin1;
  int *piVar7;
  pointer piVar8;
  iterator __end1;
  int iVar9;
  int iVar10;
  long lVar11;
  
  pbVar2 = this->pAlg;
  pbVar2->crt = pbVar2->crt - this->add;
  piVar7 = (this->removed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->removed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pbVar2->rn = pbVar2->rn + (int)((ulong)((long)piVar3 - (long)piVar7) >> 2);
  if (piVar3 != piVar7) {
    piVar8 = (pbVar2->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      piVar8[*piVar7] = -1;
      piVar7 = piVar7 + 1;
    } while (piVar7 != piVar3);
  }
  piVar8 = (this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (0 < (int)((ulong)((long)(this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar8) >> 2)) {
    lVar11 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::operator=
                ((this->pAlg->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + piVar8[lVar11],
                 (this->oldAdj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar11);
      piVar8 = (this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pbVar2 = this->pAlg;
      iVar1 = piVar8[lVar11];
      pvVar4 = (pbVar2->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar5 = (pbVar2->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (pbVar2->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = piVar6[iVar1];
      iVar10 = piVar5[iVar1];
      for (piVar7 = pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar7 != *(pointer *)
                     ((long)&pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8); piVar7 = piVar7 + 1) {
        if (*piVar7 == iVar10) {
          iVar10 = -1;
        }
        if (*piVar7 == iVar9) {
          iVar9 = -1;
        }
      }
      if (-1 < iVar10) {
        piVar6[piVar5[iVar1]] = -1;
        piVar5[piVar8[lVar11]] = -1;
      }
      if (-1 < iVar9) {
        piVar5[piVar6[piVar8[lVar11]]] = -1;
        piVar6[piVar8[lVar11]] = -1;
      }
      lVar11 = lVar11 + 1;
      piVar8 = (this->vs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar11 < (int)((ulong)((long)(this->vs).super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar8)
                           >> 2));
  }
  return;
}

Assistant:

void modified::restore() {
    pAlg->crt -= add;
    pAlg->rn += removed.size();
    for (int v : removed) pAlg->x[v] = -1;
    for (int i = 0; i < static_cast<int>(vs.size()); i++) {
        pAlg->adj[vs[i]] = oldAdj[i];
        int inV = pAlg->in[vs[i]], outV = pAlg->out[vs[i]];
        for (int u : pAlg->adj[vs[i]]) {
            if (u == inV) inV = -1;
            if (u == outV) outV = -1;
        }
        if (inV >= 0) {
            pAlg->out[pAlg->in[vs[i]]] = -1;
            pAlg->in[vs[i]] = -1;
        }
        if (outV >= 0) {
            pAlg->in[pAlg->out[vs[i]]] = -1;
            pAlg->out[vs[i]] = -1;
        }
    }
}